

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O1

void __thiscall
cppnet::TimerContainer::GetIndexTimer
          (TimerContainer *this,
          vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
          *run_timer_solts,
          vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
          *sub_timer_solts,uint32_t index,uint32_t time_pass)

{
  _Atomic_word *p_Var1;
  unordered_map<unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>_>
  *this_00;
  int iVar2;
  ulong uVar3;
  _Hash_node_base *p_Var4;
  int iVar5;
  _Rb_tree_node_base *p_Var6;
  ulong uVar7;
  _Base_ptr this_01;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Self __tmp;
  bool bVar11;
  weak_ptr<cppnet::TimerSlot> local_60;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
  local_50;
  TimerContainer *local_48;
  vector<std::weak_ptr<cppnet::TimerSlot>,std::allocator<std::weak_ptr<cppnet::TimerSlot>>>
  *local_40;
  _Rb_tree_node_base *local_38;
  
  uVar3 = (this->_timer_wheel)._M_h._M_bucket_count;
  uVar7 = (ulong)index % uVar3;
  p_Var8 = (this->_timer_wheel)._M_h._M_buckets[uVar7];
  p_Var9 = (__node_base_ptr)0x0;
  if ((p_Var8 != (__node_base_ptr)0x0) &&
     (p_Var4 = p_Var8->_M_nxt, p_Var9 = p_Var8, *(uint32_t *)&p_Var8->_M_nxt[1]._M_nxt != index)) {
    while (p_Var8 = p_Var4, p_Var4 = p_Var8->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var9 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar3 != uVar7) ||
         (p_Var9 = p_Var8, *(uint *)&p_Var4[1]._M_nxt == index)) goto LAB_00120029;
    }
    p_Var9 = (__node_base_ptr)0x0;
  }
LAB_00120029:
  if (p_Var9 == (__node_base_ptr)0x0) {
    local_50._M_cur = (__node_type *)0x0;
  }
  else {
    local_50._M_cur = (__node_type *)p_Var9->_M_nxt;
  }
  if (local_50._M_cur != (__node_type *)0x0) {
    p_Var6 = *(_Rb_tree_node_base **)
              ((long)&((local_50._M_cur)->
                      super__Hash_node_value<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>
                      ._M_storage._M_storage + 0x20);
    local_38 = (_Rb_tree_node_base *)
               ((long)&((local_50._M_cur)->
                       super__Hash_node_value<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
                       ).
                       super__Hash_node_value_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>
                       ._M_storage._M_storage + 0x10);
    local_48 = this;
    local_40 = (vector<std::weak_ptr<cppnet::TimerSlot>,std::allocator<std::weak_ptr<cppnet::TimerSlot>>>
                *)run_timer_solts;
    if (p_Var6 != local_38) {
      do {
        if (time_pass < p_Var6[1]._M_color && p_Var6[1]._M_color != _S_red) {
          for (p_Var10 = p_Var6[1]._M_parent; p_Var10 != (_Base_ptr)&p_Var6[1]._M_parent;
              p_Var10 = *(_Base_ptr *)p_Var10) {
            this_01 = p_Var10->_M_right;
            if (this_01 != (_Base_ptr)0x0) {
              iVar5 = *(int *)&this_01->_M_parent;
              do {
                if (iVar5 == 0) {
                  this_01 = (_Base_ptr)0x0;
                  break;
                }
                LOCK();
                iVar2 = *(int *)&this_01->_M_parent;
                bVar11 = iVar5 == iVar2;
                if (bVar11) {
                  *(int *)&this_01->_M_parent = iVar5 + 1;
                  iVar2 = iVar5;
                }
                iVar5 = iVar2;
                UNLOCK();
              } while (!bVar11);
            }
            if (this_01 == (_Base_ptr)0x0) {
              local_60.super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
            }
            else {
              if (*(int *)&this_01->_M_parent == 0) {
                local_60.super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
              }
              else {
                local_60.super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)p_Var10->_M_left;
              }
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var1 = (_Atomic_word *)((long)&this_01->_M_parent + 4);
                *p_Var1 = *p_Var1 + 1;
                UNLOCK();
              }
              else {
                p_Var1 = (_Atomic_word *)((long)&this_01->_M_parent + 4);
                *p_Var1 = *p_Var1 + 1;
              }
            }
            local_60.super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01;
            std::
            vector<std::weak_ptr<cppnet::TimerSlot>,std::allocator<std::weak_ptr<cppnet::TimerSlot>>>
            ::emplace_back<std::weak_ptr<cppnet::TimerSlot>>
                      ((vector<std::weak_ptr<cppnet::TimerSlot>,std::allocator<std::weak_ptr<cppnet::TimerSlot>>>
                        *)sub_timer_solts,&local_60);
            if ((_Base_ptr)
                local_60.super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Base_ptr)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var1 = &(local_60.super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_weak_count;
                iVar5 = *p_Var1;
                *p_Var1 = *p_Var1 + -1;
                UNLOCK();
              }
              else {
                iVar5 = (local_60.super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_weak_count;
                (local_60.super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count = iVar5 + -1;
              }
              if (iVar5 == 1) {
                (*(local_60.super___weak_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
              }
            }
            if (this_01 != (_Base_ptr)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
            }
          }
        }
        else {
          std::
          vector<std::weak_ptr<cppnet::TimerSlot>,std::allocator<std::weak_ptr<cppnet::TimerSlot>>>
          ::_M_range_insert<std::_List_iterator<std::weak_ptr<cppnet::TimerSlot>>>
                    (local_40,*(undefined8 *)(local_40 + 8),p_Var6[1]._M_parent,&p_Var6[1]._M_parent
                    );
        }
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      } while (p_Var6 != local_38);
    }
    this_00 = &local_48->_timer_wheel;
    Bitmap::Remove(&local_48->_bitmap,local_48->_cur_time);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&this_00->_M_h,(const_iterator)local_50._M_cur);
  }
  return;
}

Assistant:

void TimerContainer::GetIndexTimer(std::vector<std::weak_ptr<TimerSlot>>& run_timer_solts, 
    std::vector<std::weak_ptr<TimerSlot>>& sub_timer_solts, uint32_t index, uint32_t time_pass) {
    auto bucket_iter = _timer_wheel.find(index);
    if (bucket_iter == _timer_wheel.end()) {
        return;
    }
    auto& bucket = bucket_iter->second;

    for (auto timer_list = bucket.begin(); timer_list != bucket.end(); timer_list++) {
        if (timer_list->first == 0) {
            run_timer_solts.insert(run_timer_solts.end(), timer_list->second.begin(), timer_list->second.end());
            continue;
        }

        if (timer_list->first <= time_pass) {
            run_timer_solts.insert(run_timer_solts.end(), timer_list->second.begin(), timer_list->second.end());
            continue;
        }

        for (auto timer = timer_list->second.begin(); timer != timer_list->second.end(); timer++) {
            auto target = timer->lock();
            sub_timer_solts.push_back(target);
        }
    }

    _bitmap.Remove(_cur_time);
    _timer_wheel.erase(bucket_iter);
}